

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O0

uint * Kit_TruthIsop_rec(uint *puOn,uint *puOnDc,int nVars,Kit_Sop_t *pcRes,Vec_Int_t *vStore)

{
  int nWords_00;
  int iVar1;
  uint uVar2;
  uint *puVar3;
  uint *pOut;
  uint *pIn1;
  uint *pIn1_00;
  uint *puVar4;
  uint uRes;
  int nWordsAll;
  int nWords;
  int Var;
  int k;
  int i;
  uint *pTemp1;
  uint *pTemp0;
  uint *pTemp;
  uint *puOnDc1;
  uint *puOnDc0;
  uint *puOn1;
  uint *puOn0;
  uint *puRes2;
  uint *puRes1;
  uint *puRes0;
  Kit_Sop_t *pcRes2;
  Kit_Sop_t *pcRes1;
  Kit_Sop_t *pcRes0;
  Kit_Sop_t cRes2;
  Kit_Sop_t cRes1;
  Kit_Sop_t cRes0;
  Vec_Int_t *vStore_local;
  Kit_Sop_t *pcRes_local;
  int nVars_local;
  uint *puOnDc_local;
  uint *puOn_local;
  
  nWords_00 = Kit_TruthWordNum(nVars);
  puOn_local = Vec_IntFetch(vStore,nWords_00);
  if (puOn_local == (uint *)0x0) {
    pcRes->nCubes = -1;
    puOn_local = (uint *)0x0;
  }
  else {
    iVar1 = Kit_TruthIsConst0(puOn,nVars);
    if (iVar1 == 0) {
      iVar1 = Kit_TruthIsConst1(puOnDc,nVars);
      if (iVar1 == 0) {
        if (nVars < 1) {
          __assert_fail("nVars > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitIsop.c"
                        ,0x107,
                        "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                       );
        }
        nWordsAll = nVars + -1;
        while (((-1 < nWordsAll && (iVar1 = Kit_TruthVarInSupport(puOn,nVars,nWordsAll), iVar1 == 0)
                ) && (iVar1 = Kit_TruthVarInSupport(puOnDc,nVars,nWordsAll), iVar1 == 0))) {
          nWordsAll = nWordsAll + -1;
        }
        if (nWordsAll < 0) {
          __assert_fail("Var >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitIsop.c"
                        ,0x10d,
                        "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                       );
        }
        if (nWordsAll < 5) {
          uVar2 = Kit_TruthIsop5_rec(*puOn,*puOnDc,nWordsAll + 1,pcRes,vStore);
          for (Var = 0; Var < nWords_00; Var = Var + 1) {
            puOn_local[Var] = uVar2;
          }
        }
        else {
          if (nWordsAll < 5) {
            __assert_fail("Var >= 5",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitIsop.c"
                          ,0x116,
                          "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                         );
          }
          iVar1 = Kit_TruthWordNum(nWordsAll);
          puVar3 = puOnDc + iVar1;
          pOut = puOn_local + iVar1;
          Kit_TruthSharp(puOn_local,puOn,puVar3,nWordsAll);
          pIn1 = Kit_TruthIsop_rec(puOn_local,puOnDc,nWordsAll,(Kit_Sop_t *)&cRes1.pCubes,vStore);
          if (cRes1.pCubes._4_4_ == -1) {
            pcRes->nCubes = -1;
            puOn_local = (uint *)0x0;
          }
          else {
            Kit_TruthSharp(pOut,puOn + iVar1,puOnDc,nWordsAll);
            pIn1_00 = Kit_TruthIsop_rec(pOut,puVar3,nWordsAll,(Kit_Sop_t *)&cRes2.pCubes,vStore);
            if (cRes2.pCubes._4_4_ == -1) {
              pcRes->nCubes = -1;
              puOn_local = (uint *)0x0;
            }
            else {
              Kit_TruthSharp(puOn_local,puOn,pIn1,nWordsAll);
              Kit_TruthSharp(pOut,puOn + iVar1,pIn1_00,nWordsAll);
              Kit_TruthOr(puOn_local,puOn_local,pOut,nWordsAll);
              Kit_TruthAnd(pOut,puOnDc,puVar3,nWordsAll);
              puVar3 = Kit_TruthIsop_rec(puOn_local,pOut,nWordsAll,(Kit_Sop_t *)&pcRes0,vStore);
              if (pcRes0._4_4_ == -1) {
                pcRes->nCubes = -1;
                puOn_local = (uint *)0x0;
              }
              else {
                pcRes->nLits = (int)cRes1.pCubes + (int)cRes2.pCubes + (int)pcRes0 +
                               cRes1.pCubes._4_4_ + cRes2.pCubes._4_4_;
                pcRes->nCubes = cRes1.pCubes._4_4_ + cRes2.pCubes._4_4_ + pcRes0._4_4_;
                puVar4 = Vec_IntFetch(vStore,pcRes->nCubes);
                pcRes->pCubes = puVar4;
                if (pcRes->pCubes == (uint *)0x0) {
                  pcRes->nCubes = -1;
                  puOn_local = (uint *)0x0;
                }
                else {
                  nWords = 0;
                  for (Var = 0; Var < cRes1.pCubes._4_4_; Var = Var + 1) {
                    pcRes->pCubes[nWords] =
                         *(uint *)(cRes0._0_8_ + (long)Var * 4) |
                         1 << ((byte)(nWordsAll << 1) & 0x1f);
                    nWords = nWords + 1;
                  }
                  for (Var = 0; Var < cRes2.pCubes._4_4_; Var = Var + 1) {
                    pcRes->pCubes[nWords] =
                         *(uint *)(cRes1._0_8_ + (long)Var * 4) |
                         1 << ((char)(nWordsAll << 1) + 1U & 0x1f);
                    nWords = nWords + 1;
                  }
                  for (Var = 0; Var < pcRes0._4_4_; Var = Var + 1) {
                    pcRes->pCubes[nWords] = *(uint *)(cRes2._0_8_ + (long)Var * 4);
                    nWords = nWords + 1;
                  }
                  if (nWords != pcRes->nCubes) {
                    __assert_fail("k == pcRes->nCubes",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitIsop.c"
                                  ,0x145,
                                  "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                                 );
                  }
                  Kit_TruthOr(puOn_local,pIn1,puVar3,nWordsAll);
                  Kit_TruthOr(pOut,pIn1_00,puVar3,nWordsAll);
                  iVar1 = iVar1 * 2;
                  for (Var = 1; Var < nWords_00 / iVar1; Var = Var + 1) {
                    for (nWords = 0; nWords < iVar1; nWords = nWords + 1) {
                      puOn_local[Var * iVar1 + nWords] = puOn_local[nWords];
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        pcRes->nLits = 0;
        pcRes->nCubes = 1;
        puVar3 = Vec_IntFetch(vStore,1);
        pcRes->pCubes = puVar3;
        if (pcRes->pCubes == (uint *)0x0) {
          pcRes->nCubes = -1;
          puOn_local = (uint *)0x0;
        }
        else {
          *pcRes->pCubes = 0;
          Kit_TruthFill(puOn_local,nVars);
        }
      }
    }
    else {
      pcRes->nLits = 0;
      pcRes->nCubes = 0;
      pcRes->pCubes = (uint *)0x0;
      Kit_TruthClear(puOn_local,nVars);
    }
  }
  return puOn_local;
}

Assistant:

unsigned * Kit_TruthIsop_rec( unsigned * puOn, unsigned * puOnDc, int nVars, Kit_Sop_t * pcRes, Vec_Int_t * vStore )
{
    Kit_Sop_t cRes0, cRes1, cRes2;
    Kit_Sop_t * pcRes0 = &cRes0, * pcRes1 = &cRes1, * pcRes2 = &cRes2;
    unsigned * puRes0, * puRes1, * puRes2;
    unsigned * puOn0, * puOn1, * puOnDc0, * puOnDc1, * pTemp, * pTemp0, * pTemp1;
    int i, k, Var, nWords, nWordsAll;
//    assert( Kit_TruthIsImply( puOn, puOnDc, nVars ) );
    // allocate room for the resulting truth table
    nWordsAll = Kit_TruthWordNum( nVars );
    pTemp = Vec_IntFetch( vStore, nWordsAll );
    if ( pTemp == NULL )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    // check for constants
    if ( Kit_TruthIsConst0( puOn, nVars ) )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 0;
        pcRes->pCubes = NULL;
        Kit_TruthClear( pTemp, nVars );
        return pTemp;
    }
    if ( Kit_TruthIsConst1( puOnDc, nVars ) )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 1;
        pcRes->pCubes = Vec_IntFetch( vStore, 1 );
        if ( pcRes->pCubes == NULL )
        {
            pcRes->nCubes = -1;
            return NULL;
        }
        pcRes->pCubes[0] = 0;
        Kit_TruthFill( pTemp, nVars );
        return pTemp;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Kit_TruthVarInSupport( puOn, nVars, Var ) || 
             Kit_TruthVarInSupport( puOnDc, nVars, Var ) )
             break;
    assert( Var >= 0 );
    // consider a simple case when one-word computation can be used
    if ( Var < 5 )
    {
        unsigned uRes = Kit_TruthIsop5_rec( puOn[0], puOnDc[0], Var+1, pcRes, vStore );
        for ( i = 0; i < nWordsAll; i++ )
            pTemp[i] = uRes;
        return pTemp;
    }
    assert( Var >= 5 );
    nWords = Kit_TruthWordNum( Var );
    // cofactor
    puOn0   = puOn;    puOn1   = puOn + nWords;
    puOnDc0 = puOnDc;  puOnDc1 = puOnDc + nWords;
    pTemp0  = pTemp;   pTemp1  = pTemp + nWords;
    // solve for cofactors
    Kit_TruthSharp( pTemp0, puOn0, puOnDc1, Var );
    puRes0 = Kit_TruthIsop_rec( pTemp0, puOnDc0, Var, pcRes0, vStore );
    if ( pcRes0->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    Kit_TruthSharp( pTemp1, puOn1, puOnDc0, Var );
    puRes1 = Kit_TruthIsop_rec( pTemp1, puOnDc1, Var, pcRes1, vStore );
    if ( pcRes1->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    Kit_TruthSharp( pTemp0, puOn0, puRes0, Var );
    Kit_TruthSharp( pTemp1, puOn1, puRes1, Var );
    Kit_TruthOr( pTemp0, pTemp0, pTemp1, Var );
    Kit_TruthAnd( pTemp1, puOnDc0, puOnDc1, Var );
    puRes2 = Kit_TruthIsop_rec( pTemp0, pTemp1, Var, pcRes2, vStore );
    if ( pcRes2->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    // create the resulting cover
    pcRes->nLits  = pcRes0->nLits  + pcRes1->nLits  + pcRes2->nLits + pcRes0->nCubes + pcRes1->nCubes;
    pcRes->nCubes = pcRes0->nCubes + pcRes1->nCubes + pcRes2->nCubes;
    pcRes->pCubes = Vec_IntFetch( vStore, pcRes->nCubes );
    if ( pcRes->pCubes == NULL )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    k = 0;
    for ( i = 0; i < pcRes0->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes0->pCubes[i] | (1 << ((Var<<1)+0));
    for ( i = 0; i < pcRes1->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes1->pCubes[i] | (1 << ((Var<<1)+1));
    for ( i = 0; i < pcRes2->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes2->pCubes[i];
    assert( k == pcRes->nCubes );
    // create the resulting truth table
    Kit_TruthOr( pTemp0, puRes0, puRes2, Var );
    Kit_TruthOr( pTemp1, puRes1, puRes2, Var );
    // copy the table if needed
    nWords <<= 1;
    for ( i = 1; i < nWordsAll/nWords; i++ )
        for ( k = 0; k < nWords; k++ )
            pTemp[i*nWords + k] = pTemp[k];
    // verify in the end
//    assert( Kit_TruthIsImply( puOn, pTemp, nVars ) );
//    assert( Kit_TruthIsImply( pTemp, puOnDc, nVars ) );
    return pTemp;
}